

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_eps_abs(OSQPWorkspace *work,c_float eps_abs_new)

{
  long in_RDI;
  char *in_XMM0_Qa;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_XMM0_Qa);
  }
  else if (0.0 <= (double)in_XMM0_Qa) {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x40) = in_XMM0_Qa;
    local_8 = 0;
  }
  else {
    printf("ERROR in %s: ","osqp_update_eps_abs");
    printf("eps_abs must be nonnegative");
    printf("\n");
    local_8 = 1;
  }
  return local_8;
}

Assistant:

c_int osqp_update_eps_abs(OSQPWorkspace *work, c_float eps_abs_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that eps_abs is positive
  if (eps_abs_new < 0.) {
#ifdef PRINTING
    c_eprint("eps_abs must be nonnegative");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update eps_abs
  work->settings->eps_abs = eps_abs_new;

  return 0;
}